

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

int CMcontrol_list_wait(CMControlList cl)

{
  pthread_t pVar1;
  CMPollFunc p_Var2;
  pthread_t pVar3;
  
  pVar1 = cl->server_thread;
  pVar3 = pthread_self();
  if (pVar1 != pVar3 && pVar1 != 0) {
    fwrite("Warning:  Multiple threads calling CMnetwork_wait\n",0x32,1,_stderr);
    fwrite("          This situation may result in unexpected I/O blocking.\n",0x40,1,_stderr);
    fprintf(_stderr,"          Server thread set to %zx.\n",pVar3);
  }
  cl->server_thread = pVar3;
  p_Var2 = (cl->network_blocking_function).func;
  if (p_Var2 != (CMPollFunc)0x0) {
    (*p_Var2)((CManager)&CMstatic_trans_svcs,(cl->network_blocking_function).client_data);
  }
  CMcontrol_list_poll(cl);
  return 1;
}

Assistant:

extern
int
CMcontrol_list_wait(CMControlList cl)
{
    /* associated CM should be locked */
    if ((cl->server_thread != 0) &&
	(cl->server_thread != thr_thread_self())) {
	/* What?  We're polling, but we're not the server thread? */
	fprintf(stderr, "Warning:  Multiple threads calling CMnetwork_wait\n");
	fprintf(stderr, "          This situation may result in unexpected I/O blocking.\n");
	fprintf(stderr, "          Server thread set to %zx.\n", (size_t) thr_thread_self());
    }
    cl->server_thread = thr_thread_self();
    if (cl->network_blocking_function.func != NULL) {
	cl->network_blocking_function.func((void*)&CMstatic_trans_svcs,
					   cl->network_blocking_function.client_data);
    }
    CMcontrol_list_poll(cl);
    return 1;
}